

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

HDRImageBuffer * load_exr(char *file_path)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  int iVar4;
  ostream *poVar5;
  reference pvVar6;
  size_t i_1;
  float *channel_b;
  float *channel_g;
  float *channel_r;
  HDRImageBuffer *envmap;
  int i;
  int ret;
  EXRImage exr;
  char *err;
  undefined8 in_stack_ffffffffffffef18;
  undefined8 in_stack_ffffffffffffef20;
  undefined8 local_10d8;
  undefined8 local_10d0;
  ulong local_10c0;
  int local_1088;
  char **in_stack_ffffffffffffef88;
  char *in_stack_ffffffffffffef90;
  EXRImage *in_stack_ffffffffffffef98;
  int local_7c;
  uchar **local_70;
  int *local_68;
  int *local_60;
  int local_58;
  int local_54;
  char *local_18;
  HDRImageBuffer *local_8;
  
  InitEXRImage((EXRImage *)&stack0xffffffffffffef80);
  iVar4 = ParseMultiChannelEXRHeaderFromFile
                    (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,in_stack_ffffffffffffef88);
  if (iVar4 == 0) {
    for (local_1088 = 0; local_1088 < local_7c; local_1088 = local_1088 + 1) {
      if (local_68[local_1088] == 1) {
        local_60[local_1088] = 2;
      }
    }
    iVar4 = LoadMultiChannelEXRFromFile
                      (in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,in_stack_ffffffffffffef88
                      );
    if (iVar4 != 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"[PathTracer] ");
      poVar5 = std::operator<<(poVar5,"Error loading OpenEXR file: ");
      poVar5 = std::operator<<(poVar5,local_18);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    local_8 = (HDRImageBuffer *)operator_new(0x28);
    CGL::HDRImageBuffer::HDRImageBuffer((HDRImageBuffer *)0x19bc15);
    CGL::HDRImageBuffer::resize
              ((HDRImageBuffer *)in_stack_ffffffffffffef20,in_stack_ffffffffffffef18,(size_t)local_8
              );
    puVar1 = local_70[2];
    puVar2 = local_70[1];
    puVar3 = *local_70;
    for (local_10c0 = 0; local_10c0 < (ulong)(long)(local_58 * local_54);
        local_10c0 = local_10c0 + 1) {
      CGL::Vector3D::Vector3D
                ((Vector3D *)&stack0xffffffffffffef18,(double)*(float *)(puVar1 + local_10c0 * 4),
                 (double)*(float *)(puVar2 + local_10c0 * 4),
                 (double)*(float *)(puVar3 + local_10c0 * 4));
      pvVar6 = std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::operator[]
                         (&local_8->data,local_10c0);
      (pvVar6->field_0).field_0.x = (double)in_stack_ffffffffffffef18;
      (pvVar6->field_0).field_0.y = (double)in_stack_ffffffffffffef20;
      (pvVar6->field_0).field_0.z = (double)local_10d8;
      *(undefined8 *)((long)&pvVar6->field_0 + 0x18) = local_10d0;
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"[PathTracer] ");
    poVar5 = std::operator<<(poVar5,"Error parsing OpenEXR file: ");
    poVar5 = std::operator<<(poVar5,local_18);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_8 = (HDRImageBuffer *)0x0;
  }
  return local_8;
}

Assistant:

HDRImageBuffer* load_exr(const char* file_path) {
  
  const char* err;
  
  EXRImage exr;
  InitEXRImage(&exr);

  int ret = ParseMultiChannelEXRHeaderFromFile(&exr, file_path, &err);
  if (ret != 0) {
    msg("Error parsing OpenEXR file: " << err);
    return NULL;
  }

  for (int i = 0; i < exr.num_channels; i++) {
    if (exr.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  ret = LoadMultiChannelEXRFromFile(&exr, file_path, &err);
  if (ret != 0) {
    msg("Error loading OpenEXR file: " << err);
    exit(EXIT_FAILURE);
  }

  HDRImageBuffer* envmap = new HDRImageBuffer();
  envmap->resize(exr.width, exr.height);
  float* channel_r = (float*) exr.images[2];
  float* channel_g = (float*) exr.images[1];
  float* channel_b = (float*) exr.images[0];
  for (size_t i = 0; i < exr.width * exr.height; i++) {
    envmap->data[i] = Vector3D(channel_r[i], 
                               channel_g[i], 
                               channel_b[i]);
  }

  return envmap;
}